

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool __thiscall ghc::filesystem::path::has_root_path(path *this)

{
  bool bVar1;
  undefined1 local_11;
  path *this_local;
  
  bVar1 = has_root_name(this);
  local_11 = true;
  if (!bVar1) {
    local_11 = has_root_directory(this);
  }
  return local_11;
}

Assistant:

GHC_INLINE bool path::has_root_path() const
{
    return has_root_name() || has_root_directory();
}